

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMemoryStressTests.cpp
# Opt level: O3

void __thiscall deqp::egl::anon_unknown_0::MemoryAllocator::allocatePBuffer(MemoryAllocator *this)

{
  Random *rnd;
  pointer *pppvVar1;
  int iVar2;
  iterator __position;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> first;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> last;
  void *pvVar3;
  int iVar4;
  deUint32 dVar5;
  GLenum GVar6;
  Library *pLVar7;
  undefined4 extraout_var;
  float fVar8;
  EGLSurface surface;
  void *val;
  EGLint attribList [5];
  void *local_68;
  float local_5c;
  float local_58;
  float local_54;
  void *local_50;
  undefined4 local_48;
  deUint32 local_44;
  undefined4 local_40;
  deUint32 local_3c;
  undefined4 local_38;
  
  std::vector<void_*,_std::allocator<void_*>_>::reserve
            (&this->m_pbuffers,
             ((long)(this->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) + 1);
  pLVar7 = EglTestContext::getLibrary(this->m_eglTestCtx);
  rnd = &this->m_rnd;
  iVar4 = this->m_minWidth;
  iVar2 = this->m_maxWidth;
  local_44 = deRandom_getUint32(&rnd->m_rnd);
  if (iVar2 != 0x7fffffff || iVar4 != -0x80000000) {
    local_44 = local_44 % ((iVar2 - iVar4) + 1U) + iVar4;
  }
  iVar4 = this->m_minHeight;
  iVar2 = this->m_maxHeight;
  local_3c = deRandom_getUint32(&rnd->m_rnd);
  if (iVar2 != 0x7fffffff || iVar4 != -0x80000000) {
    local_3c = local_3c % ((iVar2 - iVar4) + 1U) + iVar4;
  }
  local_48 = 0x3057;
  local_40 = 0x3056;
  local_38 = 0x3038;
  iVar4 = (*pLVar7->_vptr_Library[10])(pLVar7,this->m_display,this->m_config);
  local_68 = (void *)CONCAT44(extraout_var,iVar4);
  dVar5 = (*pLVar7->_vptr_Library[0x1f])(pLVar7);
  eglu::checkError(dVar5,"eglCreatePbufferSurface",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                   ,0xd2);
  __position._M_current =
       (this->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
              ((vector<void*,std::allocator<void*>> *)&this->m_pbuffers,__position,&local_68);
  }
  else {
    *__position._M_current = local_68;
    pppvVar1 = &(this->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppvVar1 = *pppvVar1 + 1;
  }
  if (this->m_use == true) {
    first._M_current =
         (this->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    last._M_current =
         (this->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (last._M_current != first._M_current) {
      local_50 = (void *)0x0;
      de::Random::
      choose<__gnu_cxx::__normal_iterator<void**,std::vector<void*,std::allocator<void*>>>,void**>
                (rnd,first,last,&local_50,1);
      pvVar3 = local_50;
      fVar8 = deRandom_getFloat(&rnd->m_rnd);
      local_54 = deRandom_getFloat(&rnd->m_rnd);
      local_58 = deRandom_getFloat(&rnd->m_rnd);
      local_5c = deRandom_getFloat(&rnd->m_rnd);
      (*pLVar7->_vptr_Library[0x27])(pLVar7,this->m_display,local_68,local_68,pvVar3);
      dVar5 = (*pLVar7->_vptr_Library[0x1f])(pLVar7);
      eglu::checkError(dVar5,"makeCurrent(m_display, surface, surface, context)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                       ,0xe0);
      (*(this->m_gl).clearColor)(fVar8,local_54,local_58,local_5c);
      GVar6 = (*(this->m_gl).getError)();
      glu::checkError(GVar6,"glClearColor()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                      ,0xe3);
      (*(this->m_gl).clear)(0x4000);
      GVar6 = (*(this->m_gl).getError)();
      glu::checkError(GVar6,"glClear()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                      ,0xe6);
      (*pLVar7->_vptr_Library[0x27])(pLVar7,this->m_display,0,0,0);
      dVar5 = (*pLVar7->_vptr_Library[0x1f])(pLVar7);
      eglu::checkError(dVar5,
                       "makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                       ,0xe8);
    }
  }
  return;
}

Assistant:

void MemoryAllocator::allocatePBuffer (void)
{
	// Reserve space for new allocations
	try
	{
		m_pbuffers.reserve(m_pbuffers.size() + 1);
	}
	catch (const std::bad_alloc&)
	{
		m_errorString	= "std::bad_alloc when allocating more space for testcase. Out of host memory.";
		m_failed		= true;
		return;
	}

	// Allocate pbuffer
	try
	{
		const Library&	egl				= m_eglTestCtx.getLibrary();
		const EGLint	width			= m_rnd.getInt(m_minWidth, m_maxWidth);
		const EGLint	height			= m_rnd.getInt(m_minHeight, m_maxHeight);
		const EGLint	attribList[]	=
		{
			EGL_WIDTH,	width,
			EGL_HEIGHT, height,
			EGL_NONE
		};

		EGLSurface		surface			= egl.createPbufferSurface(m_display, m_config, attribList);
		EGLU_CHECK_MSG(egl, "eglCreatePbufferSurface");

		DE_ASSERT(surface != EGL_NO_SURFACE);

		m_pbuffers.push_back(surface);

		if (m_use && m_contexts.size() > 0)
		{
			EGLContext				context		= m_rnd.choose<EGLContext>(m_contexts.begin(), m_contexts.end());
			const float				red			= m_rnd.getFloat();
			const float				green		= m_rnd.getFloat();
			const float				blue		= m_rnd.getFloat();
			const float				alpha		= m_rnd.getFloat();

			EGLU_CHECK_CALL(egl, makeCurrent(m_display, surface, surface, context));

			m_gl.clearColor(red, green, blue, alpha);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClearColor()");

			m_gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClear()");

			EGLU_CHECK_CALL(egl, makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
		}
	}
	catch (const eglu::Error& error)
	{
		if (error.getError() == EGL_BAD_ALLOC)
		{
			m_errorString	= "eglCreatePbufferSurface returned EGL_BAD_ALLOC";
			m_failed		= true;
			return;
		}
		else
			throw;
	}
}